

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O2

sysbvm_tuple_t sysbvm_filesystem_extension(sysbvm_context_t *context,sysbvm_tuple_t path)

{
  _Bool _Var1;
  ulong uVar2;
  sysbvm_tuple_t sVar3;
  size_t i;
  ulong uVar4;
  ulong uVar5;
  
  _Var1 = sysbvm_tuple_isBytes(path);
  if (_Var1) {
    if ((path & 0xf) == 0 && path != 0) {
      uVar5 = (ulong)*(uint *)(path + 0xc);
    }
    else {
      uVar5 = 0;
    }
    uVar2 = uVar5;
    for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      if (*(char *)(path + 0x10 + uVar4) == '.') {
        uVar2 = uVar4;
      }
    }
    sVar3 = sysbvm_string_createWithString(context,uVar5 - uVar2,(char *)(path + 0x10 + uVar2));
    return sVar3;
  }
  return path;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_filesystem_extension(sysbvm_context_t *context, sysbvm_tuple_t path)
{
    if(!sysbvm_tuple_isBytes(path))
        return path;

    size_t pathSize = sysbvm_tuple_getSizeInBytes(path);
    uint8_t *pathBytes = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(path)->bytes;
    size_t extensionStart = pathSize;
    for(size_t i = 0; i < pathSize; ++i)
    {
        char separator = pathBytes[i];
        if(separator == '.')
            extensionStart = i;
    }

    return sysbvm_string_createWithString(context, pathSize - extensionStart, (const char*)(pathBytes + extensionStart));
}